

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O1

void yprp_when(lys_ypr_ctx_conflict *pctx,lysp_when *when,int8_t *flag)

{
  uint16_t *puVar1;
  lysp_ext_instance *plVar2;
  ulong in_RAX;
  lysp_ext_instance *plVar3;
  ulong uVar4;
  lysp_ext_instance *ext;
  uint64_t u;
  lysp_ext_instance *plVar5;
  int8_t inner_flag;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX & 0xffffffffffffff;
  if (when != (lysp_when *)0x0) {
    if ((flag != (int8_t *)0x0) && (*flag == '\0')) {
      *flag = '\x01';
      ly_print_((pctx->field_0).field_0.out,">\n");
    }
    uVar4 = 0;
    if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
        (undefined1  [24])0x0) {
      uVar4 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
    }
    plVar5 = (lysp_ext_instance *)0x0;
    ly_print_((pctx->field_0).field_0.out,"%*s<when condition=\"",uVar4,"");
    lyxml_dump_text((pctx->field_0).field_0.out,when->cond,'\x01');
    ly_print_((pctx->field_0).field_0.out,"\"");
    puVar1 = &(pctx->field_0).field_0.level;
    *puVar1 = *puVar1 + 1;
    plVar2 = when->exts;
    ext = plVar2;
    while( true ) {
      if (plVar2 == (lysp_ext_instance *)0x0) {
        plVar3 = (lysp_ext_instance *)0x0;
      }
      else {
        plVar3 = plVar2[-1].exts;
      }
      if (plVar3 <= plVar5) break;
      yprp_extension_instance(pctx,LY_STMT_WHEN,'\0',ext,(int8_t *)((long)&uStack_38 + 7));
      plVar5 = (lysp_ext_instance *)((long)&plVar5->name + 1);
      ext = ext + 1;
    }
    ypr_description(pctx,when->dsc,when->exts,(int8_t *)((long)&uStack_38 + 7));
    ypr_reference(pctx,when->ref,when->exts,(int8_t *)((long)&uStack_38 + 7));
    puVar1 = &(pctx->field_0).field_0.level;
    *puVar1 = *puVar1 - 1;
    ypr_close(pctx,"when",uStack_38._7_1_);
  }
  return;
}

Assistant:

static void
yprp_when(struct lys_ypr_ctx *pctx, struct lysp_when *when, int8_t *flag)
{
    int8_t inner_flag = 0;

    if (!when) {
        return;
    }

    ypr_close_parent(pctx, flag);
    ly_print_(pctx->out, "%*s<when condition=\"", INDENT);
    lyxml_dump_text(pctx->out, when->cond, 1);
    ly_print_(pctx->out, "\"");

    LEVEL++;
    yprp_extension_instances(pctx, LY_STMT_WHEN, 0, when->exts, &inner_flag);
    ypr_description(pctx, when->dsc, when->exts, &inner_flag);
    ypr_reference(pctx, when->ref, when->exts, &inner_flag);
    LEVEL--;
    ypr_close(pctx, "when", inner_flag);
}